

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DLevelScript::Serialize(DLevelScript *this,FArchive *arc)

{
  int iVar1;
  FBehavior *pFVar2;
  uint uVar3;
  FArchive *pFVar4;
  SDWORD *pSVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  BYTE val;
  WORD lib_1;
  WORD lib;
  DWORD local_2c;
  undefined1 local_25;
  ushort local_24;
  WORD local_22;
  
  DObject::Serialize(&this->super_DObject,arc);
  P_SerializeACSScriptNumber(arc,&this->script,false);
  local_25 = (undefined1)this->state;
  FArchive::operator<<(arc,&local_25);
  this->state = (uint)(byte)local_25;
  pFVar4 = FArchive::operator<<(arc,(DWORD *)&this->statedata);
  pFVar4 = FArchive::SerializeObject
                     (pFVar4,(DObject **)&this->activator,AActor::RegistrationInfo.MyClass);
  pFVar4 = ::operator<<(pFVar4,&this->activationline);
  pFVar4 = FArchive::operator<<(pFVar4,&this->backSide);
  FArchive::operator<<(pFVar4,(DWORD *)&this->numlocalvars);
  iVar1 = this->numlocalvars;
  if (arc->m_Loading == true) {
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar6 = (long)iVar1 * 4;
    }
    pSVar5 = (SDWORD *)operator_new__(uVar6);
    this->localvars = pSVar5;
  }
  local_2c = 0;
  if (iVar1 != 0) {
    lVar8 = 0;
    uVar3 = 1;
    do {
      uVar7 = uVar3;
      FArchive::operator<<(arc,(DWORD *)((long)this->localvars + lVar8));
      lVar8 = lVar8 + 4;
      uVar3 = uVar7 + 1;
      local_2c = uVar7;
    } while (uVar7 < (uint)this->numlocalvars);
  }
  if (arc->m_Storing == true) {
    local_22 = (WORD)((int)this->activeBehavior->LibraryID >> 0x14);
    FArchive::operator<<(arc,&local_22);
    local_2c = *(int *)&this->pc - *(int *)&this->activeBehavior->Data;
    FArchive::operator<<(arc,&local_2c);
  }
  else {
    pFVar4 = FArchive::operator<<(arc,&local_24);
    FArchive::operator<<(pFVar4,&local_2c);
    pFVar2 = FBehavior::StaticModules.Array[local_24];
    this->activeBehavior = pFVar2;
    this->pc = (int *)(pFVar2->Data + local_2c);
  }
  pFVar4 = SerializeFFontPtr(arc,&this->activefont);
  pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&this->hudwidth);
  FArchive::operator<<(pFVar4,(DWORD *)&this->hudheight);
  pFVar4 = FArchive::operator<<(arc,(DWORD *)&this->ClipRectLeft);
  pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&this->ClipRectTop);
  pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&this->ClipRectWidth);
  pFVar4 = FArchive::operator<<(pFVar4,(DWORD *)&this->ClipRectHeight);
  FArchive::operator<<(pFVar4,(DWORD *)&this->WrapWidth);
  FArchive::operator<<(arc,(DWORD *)&this->InModuleScriptNumber);
  return;
}

Assistant:

void DLevelScript::Serialize (FArchive &arc)
{
	DWORD i;

	Super::Serialize (arc);

	P_SerializeACSScriptNumber(arc, script, false);

	arc	<< state
		<< statedata
		<< activator
		<< activationline
		<< backSide
		<< numlocalvars;

	if (arc.IsLoading())
	{
		localvars = new SDWORD[numlocalvars];
	}
	for (i = 0; i < (DWORD)numlocalvars; i++)
	{
		arc << localvars[i];
	}

	if (arc.IsStoring ())
	{
		WORD lib = activeBehavior->GetLibraryID() >> LIBRARYID_SHIFT;
		arc << lib;
		i = activeBehavior->PC2Ofs (pc);
		arc << i;
	}
	else
	{
		WORD lib;
		arc << lib << i;
		activeBehavior = FBehavior::StaticGetModule (lib);
		pc = activeBehavior->Ofs2PC (i);
	}

	arc << activefont
		<< hudwidth << hudheight;
	arc << ClipRectLeft << ClipRectTop << ClipRectWidth << ClipRectHeight
		<< WrapWidth;
	arc << InModuleScriptNumber;
}